

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

void __thiscall
rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients(Polynomial<double> *this)

{
  size_t sVar1;
  pointer pcVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range2;
  double dVar3;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  double local_38;
  double dStack_30;
  pointer local_28;
  pointer local_20;
  const_iterator local_18;
  
  local_38 = 0.0;
  dStack_30 = 0.0;
  local_20 = (this->coefficients_).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_28 = (this->coefficients_).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (pcVar2 = local_28; pcVar2 != local_20; pcVar2 = pcVar2 + 1) {
    local_38 = local_38 + *(double *)pcVar2->_M_value;
    dStack_30 = dStack_30 + *(double *)(pcVar2->_M_value + 8);
  }
  if (0x10 < (ulong)((long)local_20 - (long)local_28)) {
    dVar3 = std::abs<double>((complex<double> *)&local_38);
    local_28 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_20 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      std::
      find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients()::_lambda(std::complex<double>)_1_>
                (&local_18);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::erase
                (&this->coefficients_,local_18,
                 (this->coefficients_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      local_28 = (this->coefficients_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_20 = (this->coefficients_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  sVar1 = (long)local_20 - (long)local_28 >> 4;
  this->size_ = sVar1;
  this->order_ = sVar1 - 1;
  return;
}

Assistant:

void Polynomial<T>::removeHighOrderZeroCoefficients() {

            Complex sum(0);
            for (auto c : coefficients_)
                sum += c;

            if (coefficients_.size() > 1 && std::abs(sum) != 0) {
                auto it = std::find_if(coefficients_.rbegin(), coefficients_.rend(), [](Complex v){ return std::abs(v) != 0;      });
                coefficients_.erase(it.base(), coefficients_.end());
            }
            updateOrderAndSize();
        }